

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

uint64_t __thiscall
r_comp::Decompiler::decompile
          (Decompiler *this,Image *image,ostringstream *stream,uint64_t time_offset,
          bool ignore_named_objects)

{
  uint64_t uVar1;
  size_t sVar2;
  ushort local_3a;
  uint16_t i;
  uint64_t object_count;
  bool ignore_named_objects_local;
  uint64_t time_offset_local;
  ostringstream *stream_local;
  Image *image_local;
  Decompiler *this_local;
  
  this->ignore_named_objects = ignore_named_objects;
  uVar1 = decompile_references(this,image);
  local_3a = 0;
  while( true ) {
    sVar2 = r_code::vector<r_code::SysObject_*>::size(&(image->code_segment).objects);
    if (sVar2 <= local_3a) break;
    decompile_object(this,local_3a,stream,time_offset);
    local_3a = local_3a + 1;
  }
  return uVar1;
}

Assistant:

uint64_t Decompiler::decompile(r_comp::Image *image, std::ostringstream *stream, uint64_t time_offset, bool ignore_named_objects)
{
    this->ignore_named_objects = ignore_named_objects;
    uint64_t object_count = decompile_references(image);

    for (uint16_t i = 0; i < image->code_segment.objects.size(); ++i) {
        decompile_object(i, stream, time_offset);
    }

    return object_count;
}